

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_int_int_int_int *func,char_data **args,int *args_1,int *args_2,
          int *args_3,int *args_4)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  string *local_128;
  CQueue *local_120;
  _func_void_char_data_ptr_int_int_int_int *local_118;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_f8 [40];
  string local_d0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_b0;
  function<void()> local_98 [32];
  anon_class_32_6_d2068f32 local_78;
  tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> tuple;
  
  nTimer_local = nTimer;
  local_128 = funcName;
  local_118 = func;
  if (nTimer < 0) {
    local_f8._0_8_ = 5;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_f8);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Tuple_impl<3UL,_int_&,_int_&>.super__Tuple_impl<4UL,_int_&>.
  super__Head_base<4UL,_int_&,_false>._M_head_impl =
       (_Head_base<4UL,_int_&,_false>)(_Head_base<4UL,_int_&,_false>)args_4;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Tuple_impl<3UL,_int_&,_int_&>.super__Head_base<3UL,_int_&,_false>._M_head_impl = args_3;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Head_base<2UL,_int_&,_false>._M_head_impl = args_2;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Head_base<1UL,_int_&,_false>.
  _M_head_impl = args_1;
  local_120 = this;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,int&,int&,int&,int&>(&chs,this,&tuple);
  local_f8._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_f8 + 8),(string *)from);
  std::__cxx11::string::string(local_d0,(string *)local_128);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_b0,&chs);
  local_78.func = local_118;
  local_78.args = *args;
  local_78._16_4_ = *args_1;
  local_78._20_4_ = *args_2;
  local_78._24_4_ = *args_3;
  local_78._28_4_ = *args_4;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&)::_lambda()_1_,void>
            (local_98,&local_78);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&local_120->newQueue,(queueEntry_t *)local_f8);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_f8);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_128,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}